

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O2

void __thiscall Flic::readBrun(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong __n;
  long lVar8;
  undefined1 local_3d;
  int local_3c;
  int iStack_38;
  uint8_t packets;
  char local_31 [8];
  char count;
  
  uVar3 = header->depth >> 3;
  __n = (ulong)uVar3;
  local_3c = -1;
  for (uVar5 = 0; uVar5 < header->height; uVar5 = uVar5 + 1) {
    std::istream::read((char *)is,(long)&local_3d);
    iVar6 = 0;
    while (uVar1 = header->width, iVar6 < (int)(uint)uVar1) {
      uVar2 = header->height;
      iStack_38 = iVar6;
      std::istream::read((char *)is,(long)local_31);
      if (local_31[0] < '\0') {
        lVar8 = (long)(int)((((uint)uVar2 + local_3c) * (uint)uVar1 + iStack_38) * (uint)uVar3);
        for (lVar7 = 0; lVar7 < -(int)local_31[0]; lVar7 = lVar7 + 1) {
          pvVar4 = operator_new__(__n);
          std::istream::read((char *)is,(long)pvVar4);
          memcpy(frame->pixels + lVar8,pvVar4,__n);
          operator_delete(pvVar4);
          lVar8 = lVar8 + __n;
        }
        iVar6 = iStack_38 - local_31[0];
      }
      else {
        pvVar4 = operator_new__(__n);
        std::istream::read((char *)is,(long)pvVar4);
        lVar7 = (long)(int)((((uint)uVar2 + local_3c) * (uint)uVar1 + iStack_38) * (uint)uVar3);
        for (lVar8 = 0; lVar8 < local_31[0]; lVar8 = lVar8 + 1) {
          memcpy(frame->pixels + lVar7,pvVar4,__n);
          lVar7 = lVar7 + __n;
        }
        iVar6 = iStack_38 + local_31[0];
        operator_delete(pvVar4);
      }
    }
    local_3c = local_3c + -1;
  }
  return;
}

Assistant:

void Flic::readBrun(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	for (int y = 0; y < header.height; ++y) {
		uint8_t packets;
		is.read(reinterpret_cast<char*>(&packets), 1);
		int x = 0;
		while (x < header.width) {
			int offset = ((header.height - y - 1) * header.width + x) * bytespp;
			char count;
			is.read(&count, 1);
			if (count >= 0) {
				char *tmp = new char[bytespp];
				is.read(tmp, bytespp);
				for (int j = 0; j < count; ++j) {
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
				}
				x += count;
				delete tmp;
			} else {
				for (int j = 0; j < (-count); ++j) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					delete tmp;
				}
				x += -count;
			}
		}
	}
}